

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O0

void do_repeat_this_on_new_proc(Am_Object *cmd)

{
  bool bVar1;
  Am_Value *value;
  Am_Object local_a8;
  Am_Value local_a0;
  Am_Value local_90;
  Am_Object local_80;
  Am_Object local_78;
  Am_Object local_70;
  Am_Object new_cmd;
  Am_Handler_Selective_Repeat_New_Method method;
  undefined1 local_50 [8];
  Am_Value cur_sel;
  Am_Object local_38;
  Am_Object undo_handler;
  Am_Object local_20;
  Am_Object local_18;
  Am_Object command_to_undo;
  Am_Object *cmd_local;
  
  command_to_undo.data = (Am_Object_Data *)cmd;
  Am_Object::Am_Object(&local_20,cmd);
  get_command_to_undo(&local_18);
  Am_Object::~Am_Object(&local_20);
  Am_Object::Am_Object((Am_Object *)&cur_sel.value,cmd);
  get_undo_handler(&local_38);
  Am_Object::~Am_Object((Am_Object *)&cur_sel.value);
  bVar1 = Am_Object::Valid(&local_18);
  if (bVar1) {
    Am_Value::Am_Value((Am_Value *)local_50);
    Am_Object::Am_Object((Am_Object *)&method.Call,cmd);
    get_current_sel((Am_Object *)&method.Call,(Am_Value *)local_50);
    Am_Object::~Am_Object((Am_Object *)&method.Call);
    Am_Handler_Selective_Repeat_New_Method::Am_Handler_Selective_Repeat_New_Method
              ((Am_Handler_Selective_Repeat_New_Method *)&new_cmd);
    value = Am_Object::Get(&local_38,0x14a,0);
    Am_Handler_Selective_Repeat_New_Method::operator=
              ((Am_Handler_Selective_Repeat_New_Method *)&new_cmd,value);
    Am_Object::Am_Object(&local_78,&local_38);
    Am_Object::Am_Object(&local_80,&local_18);
    Am_Value::Am_Value(&local_90,(Am_Value *)local_50);
    Am_Value::Am_Value(&local_a0,&Am_No_Value);
    (*(code *)method.from_wrapper)(&local_70,&local_78,&local_80,&local_90,&local_a0);
    Am_Value::~Am_Value(&local_a0);
    Am_Value::~Am_Value(&local_90);
    Am_Object::~Am_Object(&local_80);
    Am_Object::~Am_Object(&local_78);
    Am_Object::~Am_Object(&local_70);
    Am_Value::~Am_Value((Am_Value *)local_50);
  }
  Am_Object::Am_Object(&local_a8,cmd);
  mark_changed_command_to_undo(&local_a8);
  Am_Object::~Am_Object(&local_a8);
  Am_Object::~Am_Object(&local_38);
  Am_Object::~Am_Object(&local_18);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, do_repeat_this_on_new, (Am_Object cmd))
{
  Am_Object command_to_undo = get_command_to_undo(cmd);
  Am_Object undo_handler = get_undo_handler(cmd);
  if (command_to_undo.Valid()) {
    Am_Value cur_sel;
    get_current_sel(cmd, cur_sel);
    Am_Handler_Selective_Repeat_New_Method method;
    method = undo_handler.Get(Am_SELECTIVE_REPEAT_ON_NEW_METHOD);
    Am_Object new_cmd =
        method.Call(undo_handler, command_to_undo, cur_sel, Am_No_Value);
  }
  mark_changed_command_to_undo(cmd);
}